

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

uint8_t bcm2835_i2c_read_register_rs(char *regaddr,char *buf,uint32_t len)

{
  uint *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint32_t *paddr;
  ulong uVar5;
  byte bVar6;
  uint32_t uVar7;
  byte bVar8;
  
  paddr = bcm2835_bsc1;
  puVar1 = bcm2835_bsc1 + 1;
  bcm2835_peri_set_bits(bcm2835_bsc1,0x20,0x20);
  if (debug == '\0') {
    *puVar1 = 0x302;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar1,0x302);
  }
  puVar2 = paddr + 2;
  if (debug == '\0') {
    *puVar2 = 1;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar2,1);
  }
  if (debug == '\0') {
    *paddr = 0x8000;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",paddr,0x8000);
  }
  puVar3 = paddr + 4;
  if (debug == '\0') {
    *puVar3 = (int)*regaddr;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar3);
  }
  if (debug == '\0') {
    *paddr = 0x8080;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",paddr,0x8080);
  }
  do {
    while( true ) {
      if (debug == '\0') {
        if ((*puVar1 & 1) != 0) goto LAB_001034f4;
      }
      else {
        printf("bcm2835_peri_read  paddr %p\n",puVar1);
      }
      if (debug == '\0') break;
      printf("bcm2835_peri_read  paddr %p\n",puVar1);
    }
  } while ((*puVar1 & 2) == 0);
LAB_001034f4:
  if (debug == '\0') {
    *puVar2 = len;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",puVar2,(ulong)len);
  }
  if (debug == '\0') {
    *paddr = 0x8081;
  }
  else {
    printf("bcm2835_peri_write paddr %p, value %08X\n",paddr,0x8081);
  }
  bcm2835_delayMicroseconds((long)i2c_byte_wait_us * 3);
  uVar5 = 0;
LAB_00103562:
  if (debug == '\0') {
    if ((*puVar1 & 2) != 0) goto LAB_00103607;
  }
  else {
    printf("bcm2835_peri_read  paddr %p\n",puVar1);
  }
  for (uVar7 = len; len = 0, uVar7 != 0; uVar7 = uVar7 - 1) {
    len = uVar7;
    if (debug != '\0') {
      printf("bcm2835_peri_read  paddr %p\n",puVar1);
      break;
    }
    if ((*puVar1 & 0x20) == 0) break;
    buf[uVar5] = (char)*puVar3;
    uVar5 = (ulong)((int)uVar5 + 1);
  }
  goto LAB_00103562;
LAB_00103607:
  if (len == 0) {
    bVar8 = 0;
  }
  else {
    do {
      if (debug != '\0') {
        printf("bcm2835_peri_read  paddr %p\n",puVar1);
        bVar8 = 4;
        goto LAB_00103681;
      }
      uVar4 = *puVar1;
      if ((uVar4 & 0x20) == 0) break;
      buf[uVar5] = (char)*puVar3;
      uVar5 = (ulong)((int)uVar5 + 1);
      len = len - 1;
    } while (len != 0);
    bVar8 = (byte)((uVar4 & 0x20) >> 3) ^ 4;
  }
LAB_00103681:
  if (debug == '\0') {
    bVar6 = 1;
    if ((*puVar1 >> 8 & 1) != 0) goto LAB_001036e8;
  }
  else {
    printf("bcm2835_peri_read  paddr %p\n",puVar1);
  }
  if (debug == '\0') {
    bVar6 = 2;
    if ((*puVar1 >> 9 & 1) == 0) {
      bVar6 = bVar8;
    }
  }
  else {
    printf("bcm2835_peri_read  paddr %p\n",puVar1);
    bVar6 = bVar8;
  }
LAB_001036e8:
  bcm2835_peri_set_bits(paddr,2,2);
  return bVar6;
}

Assistant:

uint8_t bcm2835_i2c_read_register_rs(char* regaddr, char* buf, uint32_t len)
{   
#ifdef I2C_V1
    volatile uint32_t* dlen    = bcm2835_bsc0 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc0 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc0 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc0 + BCM2835_BSC_C/4;
#else
    volatile uint32_t* dlen    = bcm2835_bsc1 + BCM2835_BSC_DLEN/4;
    volatile uint32_t* fifo    = bcm2835_bsc1 + BCM2835_BSC_FIFO/4;
    volatile uint32_t* status  = bcm2835_bsc1 + BCM2835_BSC_S/4;
    volatile uint32_t* control = bcm2835_bsc1 + BCM2835_BSC_C/4;
#endif    
	uint32_t remaining = len;
    uint32_t i = 0;
    uint8_t reason = BCM2835_I2C_REASON_OK;
    
    /* Clear FIFO */
    bcm2835_peri_set_bits(control, BCM2835_BSC_C_CLEAR_1 , BCM2835_BSC_C_CLEAR_1 );
    /* Clear Status */
    bcm2835_peri_write(status, BCM2835_BSC_S_CLKT | BCM2835_BSC_S_ERR | BCM2835_BSC_S_DONE);
    /* Set Data Length */
    bcm2835_peri_write(dlen, 1);
    /* Enable device and start transfer */
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN);
    bcm2835_peri_write(fifo, regaddr[0]);
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST);
    
    /* poll for transfer has started */
    while ( !( bcm2835_peri_read(status) & BCM2835_BSC_S_TA ) )
    {
        /* Linux may cause us to miss entire transfer stage */
        if(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE)
            break;
    }
    
    /* Send a repeated start with read bit set in address */
    bcm2835_peri_write(dlen, len);
    bcm2835_peri_write(control, BCM2835_BSC_C_I2CEN | BCM2835_BSC_C_ST  | BCM2835_BSC_C_READ );
    
    /* Wait for write to complete and first byte back. */
    bcm2835_delayMicroseconds(i2c_byte_wait_us * 3);
    
    /* wait for transfer to complete */
    while (!(bcm2835_peri_read(status) & BCM2835_BSC_S_DONE))
    {
        /* we must empty the FIFO as it is populated and not use any delay */
        while (remaining && bcm2835_peri_read(status) & BCM2835_BSC_S_RXD)
    	{
	    /* Read from FIFO */
	    buf[i] = bcm2835_peri_read(fifo);
	    i++;
	    remaining--;
    	}
    }
    
    /* transfer has finished - grab any remaining stuff in FIFO */
    while (remaining && (bcm2835_peri_read(status) & BCM2835_BSC_S_RXD))
    {
        /* Read from FIFO */
        buf[i] = bcm2835_peri_read(fifo);
        i++;
        remaining--;
    }
    
    /* Received a NACK */
    if (bcm2835_peri_read(status) & BCM2835_BSC_S_ERR)
    {
		reason = BCM2835_I2C_REASON_ERROR_NACK;
    }

    /* Received Clock Stretch Timeout */
    else if (bcm2835_peri_read(status) & BCM2835_BSC_S_CLKT)
    {
	reason = BCM2835_I2C_REASON_ERROR_CLKT;
    }

    /* Not all data is sent */
    else if (remaining)
    {
	reason = BCM2835_I2C_REASON_ERROR_DATA;
    }

    bcm2835_peri_set_bits(control, BCM2835_BSC_S_DONE , BCM2835_BSC_S_DONE);

    return reason;
}